

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

int memory_tree_ns::random_sample_example_pop(memory_tree *b,uint32_t *cn)

{
  node *pnVar1;
  ostream *poVar2;
  void *this;
  size_t sVar3;
  uint *puVar4;
  uint *in_RSI;
  long in_RDI;
  float fVar5;
  uint32_t ec_id;
  int loc_at_leaf;
  float pred;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  double in_stack_ffffffffffffffb8;
  uint32_t index;
  v_array<unsigned_int> *in_stack_ffffffffffffffc0;
  float local_28;
  float local_1c;
  uint local_4;
  
  *in_RSI = 0;
  do {
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
    index = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (pnVar1->internal != 1) {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      sVar3 = v_array<unsigned_int>::size(&pnVar1->examples_index);
      if (sVar3 == 0) {
        local_4 = 0xffffffff;
      }
      else {
        fVar5 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        sVar3 = v_array<unsigned_int>::size(&pnVar1->examples_index);
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        puVar4 = v_array<unsigned_int>::operator[]
                           (&pnVar1->examples_index,(long)(int)(fVar5 * (float)sVar3));
        local_4 = *puVar4;
        v_array<memory_tree_ns::node>::operator[]
                  ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        remove_at_index<unsigned_int>(in_stack_ffffffffffffffc0,index);
      }
      return local_4;
    }
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
    if (1.0 < pnVar1->nl || pnVar1->nl == 1.0) {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      if (1.0 < pnVar1->nr || pnVar1->nr == 1.0) {
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        if ((pnVar1->nl < 1.0) ||
           (pnVar1 = v_array<memory_tree_ns::node>::operator[]
                               ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI),
           pnVar1->nr < 1.0)) {
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*in_RSI);
          poVar2 = std::operator<<(poVar2," ");
          pnVar1 = v_array<memory_tree_ns::node>::operator[]
                             ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,pnVar1->nl);
          poVar2 = std::operator<<(poVar2," ");
          pnVar1 = v_array<memory_tree_ns::node>::operator[]
                             ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
          this = (void *)std::ostream::operator<<(poVar2,pnVar1->nr);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)&std::cout,"Error:  nl = 0, and nr = 0, exit...");
          exit(0);
        }
        fVar5 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        in_stack_ffffffffffffffc0 = (v_array<unsigned_int> *)(pnVar1->nl * 1.0);
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        in_stack_ffffffffffffffb8 = pnVar1->nr;
        pnVar1 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
        local_28 = -1.0;
        if ((double)in_stack_ffffffffffffffc0 / (in_stack_ffffffffffffffb8 + pnVar1->nl) <=
            (double)fVar5) {
          local_28 = 1.0;
        }
        local_1c = local_28;
      }
      else {
        local_1c = -1.0;
      }
    }
    else {
      local_1c = 1.0;
    }
    if (0.0 <= local_1c) {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      pnVar1->nr = pnVar1->nr + -1.0;
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      *in_RSI = pnVar1->right;
    }
    else {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      pnVar1->nl = pnVar1->nl + -1.0;
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)*in_RSI);
      *in_RSI = pnVar1->left;
    }
  } while( true );
}

Assistant:

inline int random_sample_example_pop(memory_tree& b, uint32_t& cn)
    {
        cn = 0; //always start from the root:
        while (b.nodes[cn].internal == 1)
        {
            float pred = 0.;   //deal with some edge cases:
            if (b.nodes[cn].nl < 1) //no examples routed to left ever:
                pred = 1.f; //go right.
            else if (b.nodes[cn].nr < 1) //no examples routed to right ever:
                pred = -1.f; //go left.
            else if ((b.nodes[cn].nl >= 1) && (b.nodes[cn].nr >= 1))
                pred = merand48(b.all->random_state) < (b.nodes[cn].nl*1./(b.nodes[cn].nr+b.nodes[cn].nl)) ? -1.f : 1.f;
            else{
                cout<<cn<<" "<<b.nodes[cn].nl<<" "<<b.nodes[cn].nr<<endl;
                cout<<"Error:  nl = 0, and nr = 0, exit...";
                exit(0);
            }
            
            if (pred < 0){
                b.nodes[cn].nl--;
                cn = b.nodes[cn].left; 
            }
            else{
                b.nodes[cn].nr--;
                cn = b.nodes[cn].right;
            }
        }

        if (b.nodes[cn].examples_index.size() >= 1){
            int loc_at_leaf = int(merand48(b.all->random_state)*b.nodes[cn].examples_index.size());
	        uint32_t ec_id = b.nodes[cn].examples_index[loc_at_leaf];
            remove_at_index(b.nodes[cn].examples_index, loc_at_leaf); 
            return ec_id;
        }
        else    
            return -1;
    }